

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O3

void jsoncons::jsonpointer::
     remove<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *root,
               basic_json_pointer<char> *location,error_code *ec)

{
  pointer pbVar1;
  size_t sVar2;
  bool bVar3;
  char *pcVar4;
  uint uVar5;
  jsonpointer_errc __e;
  pointer pbVar6;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this;
  type tVar7;
  array_range_type aVar8;
  size_t index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  string_view_type local_60;
  detail *local_50;
  char *local_48;
  detail local_40 [16];
  
  local_50 = local_40;
  local_48 = (char *)0x0;
  local_40[0] = (detail)0x0;
  pbVar6 = (location->tokens_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (location->tokens_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this = root;
  if (pbVar6 == pbVar1) {
LAB_0039233f:
    while( true ) {
      uVar5 = *(byte *)&root->field_0 & 0xf;
      if (1 < uVar5 - 8) break;
      root = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
              ((long)&root->field_0 + 8);
    }
    if (uVar5 == 0xe) {
      if ((local_48 == (char *)0x1) && (*local_50 == (detail)0x2d)) {
        __e = index_exceeds_array_size;
      }
      else {
        local_60._M_len = 0;
        tVar7 = jsoncons::detail::dec_to_integer<unsigned_long,char>
                          (local_50,local_48,(size_t)&local_60,(unsigned_long *)(ulong)uVar5);
        sVar2 = local_60._M_len;
        __e = invalid_index;
        if (tVar7.ec == success) {
          pcVar4 = (char *)basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                                     (this);
          __e = index_exceeds_array_size;
          if (sVar2 < pcVar4) {
            aVar8 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                              (this);
            basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::erase
                      (this,aVar8.first_._M_current._M_current + local_60._M_len);
            goto LAB_00392496;
          }
        }
      }
    }
    else {
      bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object(this);
      if (bVar3) {
        local_60._M_len = (size_t)local_48;
        local_60._M_str = (char *)local_50;
        bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                          (this,&local_60);
        if (bVar3) {
          local_60._M_len = (size_t)local_48;
          local_60._M_str = (char *)local_50;
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::erase(this,&local_60);
          goto LAB_00392496;
        }
        __e = key_not_found;
      }
      else {
        __e = expected_object_or_array;
      }
    }
    std::error_code::operator=(ec,__e);
  }
  else {
    do {
      std::__cxx11::string::_M_assign((string *)&local_50);
      pbVar6 = pbVar6 + 1;
      this = root;
      if (pbVar6 == pbVar1) goto LAB_0039233f;
      local_60._M_len = (size_t)local_48;
      local_60._M_str = (char *)local_50;
      root = detail::
             resolve<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                       (root,&local_60,false,ec);
    } while (ec->_M_value == 0);
  }
LAB_00392496:
  remove<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            ((jsonpointer *)&local_50,(char *)local_40);
  return;
}

Assistant:

void remove(Json& root, const basic_json_pointer<typename Json::char_type>& location, std::error_code& ec)
    {
        Json* current = std::addressof(root);

        std::basic_string<typename Json::char_type> buffer;
        auto it = location.begin();
        auto end = location.end();

        while (it != end)
        {
            buffer = *it;
            ++it;
            if (it != end)
            {
                current = jsoncons::jsonpointer::detail::resolve(current, buffer, false, ec);
                if (JSONCONS_UNLIKELY(ec))
                    return;
            }
        }
        if (current->is_array())
        {
            if (buffer.size() == 1 && buffer[0] == '-')
            {
                ec = jsonpointer_errc::index_exceeds_array_size;
                return;
            }
            else
            {
                std::size_t index{0};
                auto result = jsoncons::detail::dec_to_integer(buffer.data(), buffer.length(), index);
                if (!result)
                {
                    ec = jsonpointer_errc::invalid_index;
                    return;
                }
                if (index >= current->size())
                {
                    ec = jsonpointer_errc::index_exceeds_array_size;
                    return;
                }
                current->erase(current->array_range().begin()+index);
            }
        }
        else if (current->is_object())
        {
            if (!current->contains(buffer))
            {
                ec = jsonpointer_errc::key_not_found;
                return;
            }
            else
            {
                current->erase(buffer);
            }
        }
        else
        {
            ec = jsonpointer_errc::expected_object_or_array;
            return;
        }
    }